

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O3

Vec_Ptr_t * Nwk_ManDfsReverse(Nwk_Man_t *pNtk)

{
  uint uVar1;
  Nwk_Obj_t *pObj;
  Tim_Man_t *p;
  long *plVar2;
  int iVar3;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  Nwk_ManIncrementTravId(pNtk);
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vNodes->pArray = ppvVar4;
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      pObj = (Nwk_Obj_t *)pVVar5->pArray[lVar6];
      if ((*(uint *)&pObj->field_0x20 & 7) == 1) {
        p = pObj->pMan->pManTime;
        if (p != (Tim_Man_t *)0x0) {
          iVar3 = Tim_ManBoxForCi(p,*(uint *)&pObj->field_0x20 >> 7);
          if (iVar3 != -1) goto LAB_008e8e32;
        }
        Nwk_ManDfsReverse_rec(pObj,vNodes);
      }
LAB_008e8e32:
      lVar6 = lVar6 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar6 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      plVar2 = (long *)pVVar5->pArray[lVar6];
      if ((((plVar2 != (long *)0x0) && ((*(uint *)(plVar2 + 4) & 7) == 3)) &&
          (*(int *)((long)plVar2 + 0x3c) == 0)) && ((int)plVar2[5] != *(int *)(*plVar2 + 0x68))) {
        uVar1 = vNodes->nSize;
        if (uVar1 == vNodes->nCap) {
          if ((int)uVar1 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar4;
            vNodes->nCap = 0x10;
          }
          else {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
            }
            vNodes->pArray = ppvVar4;
            vNodes->nCap = uVar1 * 2;
          }
        }
        else {
          ppvVar4 = vNodes->pArray;
        }
        iVar3 = vNodes->nSize;
        vNodes->nSize = iVar3 + 1;
        ppvVar4[iVar3] = plVar2;
        pVVar5 = pNtk->vObjs;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar5->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Nwk_ManDfsReverse( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i;
    Nwk_ManIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 100 );
    Nwk_ManForEachPi( pNtk, pObj, i )
        Nwk_ManDfsReverse_rec( pObj, vNodes );
    // add nodes without fanins
    Nwk_ManForEachNode( pNtk, pObj, i )
        if ( Nwk_ObjFaninNum(pObj) == 0 && !Nwk_ObjIsTravIdCurrent(pObj) )
            Vec_PtrPush( vNodes, pObj );
    return vNodes;
}